

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

CommonDebugInfoInstructions __thiscall
spvtools::opt::Instruction::GetCommonDebugOpcode(Instruction *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  CommonDebugInfoInstructions CVar4;
  FeatureManager *pFVar5;
  
  if (this->opcode_ == OpExtInst) {
    pFVar5 = IRContext::get_feature_mgr(this->context_);
    uVar1 = pFVar5->extinst_importid_OpenCL100DebugInfo_;
    pFVar5 = IRContext::get_feature_mgr(this->context_);
    uVar2 = pFVar5->extinst_importid_Shader100DebugInfo_;
    if (uVar2 != 0 || uVar1 != 0) {
      uVar3 = GetSingleWordInOperand(this,0);
      if (uVar3 == uVar1 || uVar3 == uVar2) {
        CVar4 = GetSingleWordInOperand(this,1);
        return CVar4;
      }
    }
  }
  return CommonDebugInfoInstructionsMax;
}

Assistant:

CommonDebugInfoInstructions Instruction::GetCommonDebugOpcode() const {
  if (opcode() != spv::Op::OpExtInst) {
    return CommonDebugInfoInstructionsMax;
  }

  const uint32_t opencl_set_id =
      context()->get_feature_mgr()->GetExtInstImportId_OpenCL100DebugInfo();
  const uint32_t shader_set_id =
      context()->get_feature_mgr()->GetExtInstImportId_Shader100DebugInfo();

  if (!opencl_set_id && !shader_set_id) {
    return CommonDebugInfoInstructionsMax;
  }

  const uint32_t used_set_id = GetSingleWordInOperand(kExtInstSetIdInIdx);

  if (used_set_id != opencl_set_id && used_set_id != shader_set_id) {
    return CommonDebugInfoInstructionsMax;
  }

  return CommonDebugInfoInstructions(
      GetSingleWordInOperand(kExtInstInstructionInIdx));
}